

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_validator_factory_base.hpp
# Opt level: O3

unique_ptr<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
::get_or_create_reference
          (schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *schema,
          uri_wrapper *identifier)

{
  undefined8 referred_schema;
  iterator iVar1;
  ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *prVar2
  ;
  iterator __position;
  uri_wrapper *in_RCX;
  pointer *__ptr;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_18446744073709551615UL>
  keys;
  anchor_uri_map_type anchor_dict2;
  undefined1 local_268 [16];
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  __uniq_ptr_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
  local_240;
  _Any_data local_238;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218 [8];
  __node_base local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
  local_170;
  unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *local_158;
  unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_148 [16];
  char local_c8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  iVar1 = std::
          _Rb_tree<jsoncons::uri,_std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>,_std::_Select1st<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
          ::find(*(_Rb_tree<jsoncons::uri,_std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>,_std::_Select1st<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>_>
                   **)&schema[10].field_0,&in_RCX->uri_);
  if (iVar1._M_node == (_Base_ptr)(*(long *)&schema[10].field_0 + 8)) {
    if (((in_RCX->uri_).fragment_part_.second != (in_RCX->uri_).fragment_part_.first) &&
       (in_RCX->has_plain_name_fragment_ == false)) {
      __position = std::
                   _Rb_tree<jsoncons::uri,_std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   ::find((_Rb_tree<jsoncons::uri,_std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                           *)(schema + 0x13),&in_RCX->uri_);
      if (__position._M_node != (_Base_ptr)((long)&schema[0x13].field_0 + 8)) {
        local_68._M_buckets = &local_68._M_single_bucket;
        local_68._M_bucket_count = 1;
        local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_68._M_element_count = 0;
        local_68._M_rehash_policy._M_max_load_factor = 1.0;
        local_68._M_rehash_policy._M_next_resize = 0;
        local_68._M_single_bucket = (__node_base_ptr)0x0;
        local_268._8_8_ = local_238._M_pod_data + 8;
        local_258 = 1;
        local_250._M_allocated_capacity = 0;
        local_250._8_8_ = 0;
        local_240._M_t.
        super__Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
              )(_Tuple_impl<0UL,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>
                )0x3f800000;
        local_238._M_unused._M_object = (void *)0x0;
        local_238._8_8_ = 0;
        compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        ::compilation_context
                  ((compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)&local_228.common_,in_RCX,
                   (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_268 + 8));
        keys.size_ = 0;
        keys.data_ = (pointer)&__position._M_node[5]._M_left;
        make_cross_draft_schema_validator
                  ((schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)local_268,
                   (compilation_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)schema,
                   (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   &local_228.common_,keys,(anchor_uri_map_type *)0x0);
        if (local_88 != &local_78) {
          operator_delete(local_88,local_78._M_allocated_capacity + 1);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_c0);
        if ((local_c8 == '\x01') && (local_c8 = '\0', local_158 != local_148)) {
          operator_delete(local_158,
                          (ulong)((long)local_148[0]._M_t.
                                        super___uniq_ptr_impl<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                                        .
                                        super__Head_base<0UL,_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_false>
                                        ._M_head_impl + 1));
        }
        std::
        vector<jsoncons::jsonschema::uri_wrapper,_std::allocator<jsoncons::jsonschema::uri_wrapper>_>
        ::~vector(&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_nxt != &local_188) {
          operator_delete(local_198._M_nxt,local_188._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._0_8_ != local_218) {
          operator_delete((void *)local_228._0_8_,
                          CONCAT71(local_218[0]._M_allocated_capacity._1_7_,
                                   local_218[0]._M_local_buf[0]) + 1);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)(local_268 + 8));
        std::
        _Rb_tree<jsoncons::uri,_std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::_M_erase_aux((_Rb_tree<jsoncons::uri,_std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::less<jsoncons::uri>,_std::allocator<std::pair<const_jsoncons::uri,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                        *)(schema + 0x13),(const_iterator)__position._M_node);
        referred_schema = local_268._0_8_;
        prVar2 = (ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)operator_new(0xf8);
        local_228.int64_.val_ = 0;
        local_218[0]._M_local_buf[0] = '\0';
        local_228._0_8_ = local_218;
        ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
        ref_validator(prVar2,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             identifier,&in_RCX->uri_,
                      (schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       *)referred_schema,(string *)&local_228.common_);
        this->_vptr_schema_validator_factory_base = (_func_int **)prVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._0_8_ != local_218) {
          operator_delete((void *)local_228._0_8_,
                          CONCAT71(local_218[0]._M_allocated_capacity._1_7_,
                                   local_218[0]._M_local_buf[0]) + 1);
        }
        std::
        vector<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
        ::
        emplace_back<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
                  ((vector<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
                    *)(schema + 0x10),
                   (unique_ptr<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)local_268);
        if ((schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *)local_268._0_8_ !=
            (schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *)0x0) {
          (*(*(_func_int ***)local_268._0_8_)[1])();
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::jsonschema::uri_wrapper>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_68);
        return (__uniq_ptr_data<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
                )(__uniq_ptr_data<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
                  )this;
      }
    }
    prVar2 = (ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)operator_new(0xf8);
    local_228.int64_.val_ = 0;
    local_218[0]._M_local_buf[0] = '\0';
    local_228._0_8_ = local_218;
    ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
    ref_validator(prVar2,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         identifier,&in_RCX->uri_,(string *)&local_228.common_);
    this->_vptr_schema_validator_factory_base = (_func_int **)prVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != local_218) {
      operator_delete((void *)local_228._0_8_,
                      CONCAT71(local_218[0]._M_allocated_capacity._1_7_,local_218[0]._M_local_buf[0]
                              ) + 1);
    }
    local_228._0_8_ = prVar2;
    std::
    vector<std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>,std::allocator<std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>
    ::
    emplace_back<jsoncons::uri_const&,jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>
              ((vector<std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>,std::allocator<std::pair<jsoncons::uri,jsoncons::jsonschema::ref<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*>>>
                *)&schema[0x11].field_0.json_const_pointer_.ref_,&in_RCX->uri_,
               (ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                **)&local_228);
  }
  else {
    prVar2 = (ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)operator_new(0xf8);
    local_228.int64_.val_ = 0;
    local_218[0]._M_local_buf[0] = '\0';
    local_228._0_8_ = local_218;
    ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
    ref_validator(prVar2,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         identifier,&in_RCX->uri_,
                  (schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)iVar1._M_node[5]._M_left,(string *)&local_228.common_);
    this->_vptr_schema_validator_factory_base = (_func_int **)prVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != local_218) {
      operator_delete((void *)local_228._0_8_,
                      CONCAT71(local_218[0]._M_allocated_capacity._1_7_,local_218[0]._M_local_buf[0]
                              ) + 1);
    }
  }
  return (__uniq_ptr_data<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(__uniq_ptr_data<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ref_validator<Json>> get_or_create_reference(const Json& schema, const uri_wrapper& identifier)
        {
            // a schema already exists
            auto it = this->schema_store_ptr_->find(identifier.uri());
            if (it != this->schema_store_ptr_->end())
            {
                return jsoncons::make_unique<ref_validator_type>(schema, identifier.uri(), (*it).second);
            }

            // referencing an unknown keyword, turn it into schema
            //
            // an unknown keyword can only be referenced by a JSONPointer,
            // not by a plain name identifier
            if (identifier.has_fragment() && !identifier.has_plain_name_fragment()) 
            {
                //std::string fragment = std::string(identifier.fragment());

                auto it2 = this->unknown_keywords_.find(identifier.uri());
                if (it2 != this->unknown_keywords_.end())
                {
                    auto& subsch = it2->second;
                    anchor_uri_map_type anchor_dict2;
                    auto s = make_cross_draft_schema_validator(compilation_context<Json>(identifier), subsch, {}, anchor_dict2);
                    this->unknown_keywords_.erase(it2);
                    auto orig = jsoncons::make_unique<ref_validator_type>(schema, identifier.uri(), s.get());
                    this->save_schema(std::move(s));
                    return orig;
                }
            }

            // get or create a ref_validator
            auto orig = jsoncons::make_unique<ref_validator_type>(schema, identifier.uri());

            this->unresolved_refs_.emplace_back(identifier.uri(), orig.get());
            return orig;
        }